

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

string * __thiscall Character::SourceName_abi_cxx11_(string *__return_storage_ptr__,Character *this)

{
  pointer pcVar1;
  string *psVar2;
  
  psVar2 = &this->faux_name;
  if ((this->faux_name)._M_string_length == 0) {
    psVar2 = &this->real_name;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Character::SourceName() const
{
	return faux_name.empty() ? real_name : faux_name;
}